

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_snapshots.cpp
# Opt level: O0

bool SaveSNA_ZX(path *fname,word start)

{
  uchar uVar1;
  byte *pbVar2;
  ushort uVar3;
  CDevice *pCVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  CDeviceSlot *pCVar10;
  CDevicePage *pCVar11;
  size_t sVar12;
  char *badValueMessage;
  bool bVar13;
  int (**local_148) [3];
  string local_110;
  int local_f0;
  int local_ec;
  aint i;
  int page_2;
  int *__end1;
  int *__begin1;
  int (*__range1) [3];
  int pages128 [3];
  int pages48 [3];
  CDevicePage *page_1;
  CDeviceSlot *slot_1;
  CDevicePage *page;
  CDeviceSlot *slot;
  uint uStack_90;
  byte cmpValue;
  aint ii;
  aint stackAdr;
  bool defaultStack;
  bool is48kSnap;
  byte snbuf [31];
  int SNA_HEADER_128_SIZE;
  int SNA_HEADER_48_SIZE;
  string local_48;
  FILE *local_28;
  FILE *ff;
  path *ppStack_18;
  word start_local;
  path *fname_local;
  
  ff._6_2_ = start;
  ppStack_18 = fname;
  if (DeviceID == (char *)0x0) {
    Error("[SAVESNA] Only for real device emulation mode.",(char *)0x0,PASS3);
    fname_local._7_1_ = false;
  }
  else {
    bVar5 = IsZXSpectrumDevice(DeviceID);
    if (bVar5) {
      local_28 = (FILE *)SJ_fopen(ppStack_18,"wb");
      if (local_28 == (FILE *)0x0) {
        std::filesystem::__cxx11::path::string(&local_48,ppStack_18);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        Error("opening file for write",pcVar9,PASS3);
        std::__cxx11::string::~string((string *)&local_48);
        fname_local._7_1_ = false;
      }
      else {
        _stackAdr = 0x440000369b27583f;
        snbuf[8] = '\\';
        snbuf[9] = '<';
        snbuf[10] = 0xff;
        snbuf[0xb] = '\0';
        snbuf[0xc] = '\0';
        snbuf[0xd] = 'T';
        snbuf[0xe] = '\0';
        snbuf[0xf] = '\0';
        snbuf[0x10] = '\0';
        snbuf[0x11] = '\x01';
        snbuf[0x12] = '\a';
        snbuf[0x13] = '\0';
        snbuf[0x14] = '\0';
        snbuf[0x15] = '\0';
        snbuf[0x16] = '\0';
        snbuf[5] = (byte)ff._6_2_;
        snbuf[0] = '\0';
        snbuf[1] = '+';
        snbuf[2] = '-';
        snbuf[3] = 0xdc;
        snbuf[4] = '\\';
        snbuf[6] = (byte)(ff._6_2_ >> 8);
        snbuf[7] = ':';
        iVar7 = strcmp(DeviceID,"ZXSPECTRUM48");
        bVar13 = iVar7 == 0;
        bVar5 = true;
        iVar7 = Device->ZxRamTop;
        uStack_90 = iVar7 - 3;
        slot._4_4_ = 0;
        if (bVar13) {
          slot._4_4_ = -2;
        }
        for (; pCVar4 = Device, slot._4_4_ < 4; slot._4_4_ = slot._4_4_ + 1) {
          if (slot._4_4_ < 0) {
            uVar1 = '\0';
          }
          else {
            uVar1 = "\x03\x13"[slot._4_4_];
          }
          iVar8 = CDevice::GetSlotOfA16(Device,uStack_90 + slot._4_4_);
          pCVar10 = CDevice::GetSlot(pCVar4,iVar8);
          pCVar11 = CDevice::GetPage(Device,(int)pCVar10->InitialPage);
          bVar5 = (bool)(bVar5 & uVar1 == pCVar11->RAM
                                          [(int)(uStack_90 + slot._4_4_ & pCVar11->Size - 1U)]);
        }
        if (bVar5) {
          if (bVar13) {
            iVar8 = CDevice::GetSlotOfA16(Device,iVar7 - 4U);
            pCVar10 = CDevice::GetSlot(pCVar4,iVar8);
            pCVar11 = CDevice::GetPage(Device,(int)pCVar10->InitialPage);
            pCVar11->RAM[(int)(iVar7 - 4U & pCVar11->Size - 1U)] = (byte)(ff._6_2_ >> 8);
            pCVar4 = Device;
            uStack_90 = iVar7 - 5;
            iVar7 = CDevice::GetSlotOfA16(Device,uStack_90);
            pCVar10 = CDevice::GetSlot(pCVar4,iVar7);
            pCVar11 = CDevice::GetPage(Device,(int)pCVar10->InitialPage);
            pCVar11->RAM[(int)(uStack_90 & pCVar11->Size - 1U)] = (byte)ff._6_2_;
          }
          snbuf[0xf] = (byte)uStack_90;
          snbuf[0x10] = (byte)(uStack_90 >> 8);
        }
        else if (bVar13) {
          WarningById(W_SNA_48,(char *)0x0,W_PASS3);
          snbuf._8_8_ = snbuf._8_8_ & 0xffffffffffffff;
          snbuf[0x10] = '@';
          bVar6 = (byte)ff._6_2_;
          pCVar11 = CDevice::GetPage(Device,1);
          *pCVar11->RAM = bVar6;
          uVar3 = ff._6_2_ >> 8;
          pCVar11 = CDevice::GetPage(Device,1);
          pCVar11->RAM[1] = (byte)uVar3;
        }
        else {
          snbuf._8_8_ = snbuf._8_8_ & 0xffffffffffffff;
          snbuf[0x10] = '`';
        }
        sVar12 = fwrite(&stackAdr,1,0x1b,local_28);
        if (sVar12 == 0x1b) {
          pages128[1] = 1;
          pages128[2] = 2;
          __range1._0_4_ = 5;
          __range1._4_4_ = 2;
          pCVar10 = CDevice::GetSlot(Device,3);
          pages128[0] = pCVar10->Page->Number;
          if (bVar13) {
            local_148 = (int (**) [3])(pages128 + 1);
          }
          else {
            local_148 = &__range1;
          }
          __begin1 = (int *)local_148;
          _i = (int *)((long)local_148 + 0xc);
          for (__end1 = (int *)local_148; __end1 != _i; __end1 = __end1 + 1) {
            local_ec = *__end1;
            pCVar11 = CDevice::GetPage(Device,local_ec);
            pbVar2 = pCVar11->RAM;
            pCVar11 = CDevice::GetPage(Device,local_ec);
            sVar12 = fwrite(pbVar2,1,(long)pCVar11->Size,local_28);
            pCVar11 = CDevice::GetPage(Device,local_ec);
            if ((int)sVar12 != pCVar11->Size) {
              bVar5 = writeError(ppStack_18,(FILE **)&local_28);
              return bVar5;
            }
          }
          if (!bVar13) {
            snbuf[0x13] = (byte)ff._6_2_;
            snbuf[0x14] = (byte)(ff._6_2_ >> 8);
            pCVar10 = CDevice::GetSlot(Device,3);
            snbuf[0x15] = (char)pCVar10->Page->Number + '\x10';
            snbuf[0x16] = '\0';
            sVar12 = fwrite(snbuf + 0x13,1,4,local_28);
            if (sVar12 != 4) {
              bVar5 = writeError(ppStack_18,(FILE **)&local_28);
              return bVar5;
            }
            for (local_f0 = 0; iVar7 = local_f0, local_f0 < 8; local_f0 = local_f0 + 1) {
              pCVar10 = CDevice::GetSlot(Device,3);
              if (((iVar7 != pCVar10->Page->Number) && (local_f0 != 2)) && (local_f0 != 5)) {
                pCVar11 = CDevice::GetPage(Device,local_f0);
                pbVar2 = pCVar11->RAM;
                pCVar11 = CDevice::GetPage(Device,local_f0);
                sVar12 = fwrite(pbVar2,1,(long)pCVar11->Size,local_28);
                pCVar11 = CDevice::GetPage(Device,local_f0);
                if ((int)sVar12 != pCVar11->Size) {
                  bVar5 = writeError(ppStack_18,(FILE **)&local_28);
                  return bVar5;
                }
              }
            }
          }
          iVar7 = Device->PagesCount;
          pCVar11 = CDevice::GetPage(Device,0);
          pcVar9 = W_SNA_128;
          if (0x20000 < iVar7 * pCVar11->Size) {
            std::filesystem::__cxx11::path::string(&local_110,ppStack_18);
            badValueMessage = (char *)std::__cxx11::string::c_str();
            WarningById(pcVar9,badValueMessage,W_PASS3);
            std::__cxx11::string::~string((string *)&local_110);
          }
          fclose(local_28);
          fname_local._7_1_ = true;
        }
        else {
          fname_local._7_1_ = writeError(ppStack_18,(FILE **)&local_28);
        }
      }
    }
    else {
      Error("[SAVESNA] Device must be ZXSPECTRUM48 or ZXSPECTRUM128.",(char *)0x0,PASS3);
      fname_local._7_1_ = false;
    }
  }
  return fname_local._7_1_;
}

Assistant:

bool SaveSNA_ZX(const std::filesystem::path & fname, word start) {
	// for Lua
	if (!DeviceID) {
		Error("[SAVESNA] Only for real device emulation mode.");
		return false;
	} else if (!IsZXSpectrumDevice(DeviceID)) {
		Error("[SAVESNA] Device must be ZXSPECTRUM48 or ZXSPECTRUM128.");
		return false;
	}

	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str());
		return false;
	}

	constexpr int SNA_HEADER_48_SIZE = 27;
	constexpr int SNA_HEADER_128_SIZE = 4;
	byte snbuf[SNA_HEADER_48_SIZE + SNA_HEADER_128_SIZE] = {
	//	I     L'    H'    E'    D'    C'    B'    F'    A'    L     H     E     D     C **  B **
		0x3F, 0x58, 0x27, 0x9B, 0x36, 0x00, 0x00, 0x44, 0x00, 0x2B, 0x2D, 0xDC, 0x5C, 0x00, 0x00,
	//	IYL   IYH   IXL   IXH   IFF2  R     F     A     SP(L) SP(H) IM #  border
		0x3A, 0x5C, 0x3C, 0xFF, 0x00, 0x00, 0x54, 0x00, 0x00, 0x00, 0x01, 0x07,
	// end of 48k SNA header, following 4 bytes are extra 128k SNA header "interlude" after 48k data
	//	PC(L) PC(H) 7FFD  TR-DOS
		0x00, 0x00, 0x00, 0x00
	};

	// set BC to start address
	snbuf[13] = start & 0xFF;
	snbuf[14] = (start>>8) & 0xFF;

	// check if default ZX-like stack was modified - if not, it will be used for snapshot
	bool is48kSnap = !strcmp(DeviceID, "ZXSPECTRUM48");
	bool defaultStack = true;
	aint stackAdr = Device->ZxRamTop + 1 - sizeof(ZX_STACK_DATA);
	for (aint ii = is48kSnap ? -2 : 0; ii < aint(sizeof(ZX_STACK_DATA)); ++ii) {
		// will check for 48k snap if there is `00 00` ahead of fake stack data
		const byte cmpValue = (0 <= ii) ? ZX_STACK_DATA[ii] : 0;
		CDeviceSlot* slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr + ii));
		CDevicePage* page = Device->GetPage(slot->InitialPage);
		defaultStack &= (cmpValue == page->RAM[(stackAdr + ii) & (page->Size-1)]);
	}
	if (defaultStack) {
		if (is48kSnap) {
			--stackAdr;
			// inject PC under default stack
			CDeviceSlot* slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr));
			CDevicePage* page = Device->GetPage(slot->InitialPage);
			page->RAM[stackAdr & (page->Size-1)] = (start>>8) & 0xFF;
			--stackAdr;
			slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr));
			page = Device->GetPage(slot->InitialPage);
			page->RAM[stackAdr & (page->Size-1)] = start & 0xFF;
		}
		// SP (may point to injected start address for 48k snap)
		snbuf[23] = (stackAdr) & 0xFF;
		snbuf[24] = (stackAdr>>8) & 0xFF;
	} else {
		if (is48kSnap) {
			WarningById(W_SNA_48);
			snbuf[23] = 0x00; //sp
			snbuf[24] = 0x40; //sp
			Device->GetPage(1)->RAM[0] = start & 0xFF;	//pc
			Device->GetPage(1)->RAM[1] = start >> 8;	//pc
		} else {
			snbuf[23] = 0x00; //sp
			snbuf[24] = 0x60; //sp
		}
	}

	if (fwrite(snbuf, 1, SNA_HEADER_48_SIZE, ff) != SNA_HEADER_48_SIZE) {
		return writeError(fname, ff);
	}

	const int pages48[3] = { 1, 2, 3 };
	const int pages128[3] = { 5, 2, Device->GetSlot(3)->Page->Number };

	for (const int page : is48kSnap ? pages48 : pages128) {
		if ((aint) fwrite(Device->GetPage(page)->RAM, 1, Device->GetPage(page)->Size, ff) != Device->GetPage(page)->Size) {
			return writeError(fname, ff);
		}
	}

	if (!is48kSnap) {
		// 128k snapshot extra header fields
		snbuf[27] = start & 0xFF; //pc
		snbuf[28] = (start>>8) & 0xFF; //pc
		snbuf[29] = 0x10 + Device->GetSlot(3)->Page->Number; //7ffd
		snbuf[30] = 0; //tr-dos
		if (fwrite(snbuf + SNA_HEADER_48_SIZE, 1, SNA_HEADER_128_SIZE, ff) != SNA_HEADER_128_SIZE) {
			return writeError(fname, ff);
		}
		// 128k banks
		for (aint i = 0; i < 8; i++) {
			if (i != Device->GetSlot(3)->Page->Number && i != 2 && i != 5) {
				if ((aint) fwrite(Device->GetPage(i)->RAM, 1, Device->GetPage(i)->Size, ff) != Device->GetPage(i)->Size) {
					return writeError(fname, ff);
				}
			}
		}
	}

	if (128*1024 < Device->PagesCount * Device->GetPage(0)->Size) {
		WarningById(W_SNA_128, fname.string().c_str());
	}

	fclose(ff);
	return true;
}